

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O2

mz_bool mz_zip_writer_finalize_archive(mz_zip_archive *pZip)

{
  undefined1 auVar1 [64];
  mz_zip_internal_state *pmVar2;
  undefined4 uVar3;
  int iVar4;
  size_t sVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  mz_uint64 mVar9;
  mz_uint64 mVar10;
  mz_uint64 mVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  mz_uint8 hdr [256];
  undefined1 local_128 [8];
  undefined1 uStack_120;
  undefined4 uStack_11f;
  undefined1 uStack_11b;
  undefined1 uStack_11a;
  undefined1 uStack_119;
  undefined1 uStack_118;
  undefined1 auStack_117 [3];
  undefined1 auStack_114 [44];
  undefined1 auStack_e8 [64];
  undefined1 auStack_a8 [64];
  undefined1 local_68 [64];
  
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pmVar2 = pZip->m_pState;
  if ((pmVar2 == (mz_zip_internal_state *)0x0) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) {
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  iVar4 = pmVar2->m_zip64;
  if (iVar4 == 0) {
    uVar7 = pZip->m_total_files;
    if (0xffff < uVar7) {
LAB_00114b3b:
      pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
      return 0;
    }
    uVar8 = (pmVar2->m_central_dir).m_size;
    mVar11 = pZip->m_archive_size;
    if ((uVar8 + mVar11) - 0xffffffea < 0xffffffff00000000) goto LAB_00114b3b;
  }
  else {
    uVar8 = (pmVar2->m_central_dir).m_size;
    if (0xfffffffe < uVar8) goto LAB_00114b3b;
    uVar7 = pZip->m_total_files;
    mVar11 = pZip->m_archive_size;
  }
  if (uVar7 == 0) {
    uVar7 = 0;
    mVar9 = 0;
    uVar8 = 0;
  }
  else {
    pZip->m_central_directory_file_ofs = mVar11;
    sVar5 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar11,(pmVar2->m_central_dir).m_p,uVar8);
    if (sVar5 != uVar8) goto LAB_00114dff;
    mVar10 = pZip->m_archive_size + uVar8;
    pZip->m_archive_size = mVar10;
    iVar4 = pmVar2->m_zip64;
    uVar7 = pZip->m_total_files;
    mVar9 = mVar11;
    mVar11 = mVar10;
  }
  if (iVar4 != 0) {
    auVar14 = vpmovsxbq_avx2(ZEXT416(0x20181008));
    local_68 = ZEXT1664(ZEXT816(0));
    auStack_e8 = ZEXT1664(ZEXT816(0));
    auStack_a8 = ZEXT1664(ZEXT816(0));
    auVar13 = vpbroadcastq_avx512vl();
    _local_128 = (unkuint9)0x2c06064b50;
    _uStack_11f = 0x2d031e000000;
    _uStack_118 = 0;
    auStack_114[4] = (char)uVar7;
    auStack_114[5] = (undefined1)(uVar7 >> 8);
    auStack_114[6] = (undefined1)(uVar7 >> 0x10);
    auStack_114[7] = (undefined1)(uVar7 >> 0x18);
    auStack_114._8_4_ = 0;
    auStack_114[0xc] = (char)uVar7;
    auStack_114[0xd] = auStack_114[5];
    auStack_114[0xe] = auStack_114[6];
    auStack_114[0xf] = auStack_114[7];
    auStack_114._16_4_ = 0;
    auStack_114[0x14] = (char)uVar8;
    auVar13 = vpsrlvq_avx2(auVar13,auVar14);
    auVar12 = vpmovqb_avx512vl(auVar13);
    auStack_114._21_4_ = auVar12._0_4_;
    auStack_114[0x19] = (char)(uVar8 >> 0x28);
    auVar13 = vpbroadcastq_avx512vl();
    auStack_114[0x1a] = (char)(uVar8 >> 0x30);
    auVar14 = vpsrlvq_avx2(auVar13,auVar14);
    auStack_114[0x1b] = (char)(uVar8 >> 0x38);
    auStack_114[0x1c] = (char)mVar9;
    auVar12 = vpmovqb_avx512vl(auVar14);
    auStack_114._29_4_ = auVar12._0_4_;
    auStack_114[0x21] = (char)(mVar9 >> 0x28);
    auStack_114[0x22] = (char)(mVar9 >> 0x30);
    auStack_114[0x23] = (char)(mVar9 >> 0x38);
    auStack_114._36_8_ = 0;
    sVar5 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar11,local_128,0x38);
    if (sVar5 != 0x38) goto LAB_00114dff;
    auVar15 = ZEXT1664((undefined1  [16])0x0);
    mVar10 = pZip->m_archive_size + 0x38;
    pZip->m_archive_size = mVar10;
    auVar1 = vmovdqu64_avx512f(auVar15);
    local_68 = vmovdqu64_avx512f(auVar15);
    auStack_a8 = vmovdqu64_avx512f(auVar15);
    auStack_e8 = vmovdqu64_avx512f(auVar15);
    auVar14 = vpbroadcastq_avx512vl();
    auVar14 = vpsrlvq_avx2(auVar14,_DAT_001522c0);
    stack0xfffffffffffffedc = auVar1._4_60_;
    local_128._0_4_ = 0x7064b50;
    uStack_120 = (char)mVar11;
    auVar12 = vpmovqb_avx512vl(auVar14);
    uStack_11f = auVar12._0_4_;
    uStack_11b = (char)(mVar11 >> 0x28);
    uStack_11a = (char)(mVar11 >> 0x30);
    uStack_119 = (char)(mVar11 >> 0x38);
    _auStack_117 = auVar1._17_47_;
    uStack_118 = 1;
    auVar15 = _local_128;
    stack0xfffffffffffffeeb = auVar1._19_45_;
    _local_128 = auVar15._0_18_;
    auStack_117[1] = 0;
    sVar5 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar10,local_128,0x14);
    if (sVar5 != 0x14) goto LAB_00114dff;
    mVar11 = pZip->m_archive_size + 0x14;
    pZip->m_archive_size = mVar11;
    uVar7 = pZip->m_total_files;
  }
  auVar15 = ZEXT1664((undefined1  [16])0x0);
  auVar1 = vmovdqu64_avx512f(auVar15);
  local_68 = vmovdqu64_avx512f(auVar15);
  auStack_a8 = vmovdqu64_avx512f(auVar15);
  auStack_e8 = vmovdqu64_avx512f(auVar15);
  stack0xfffffffffffffedc = auVar1._4_60_;
  local_128._0_4_ = 0x6054b50;
  uVar6 = 0xffff;
  if (uVar7 < 0xffff) {
    uVar6 = uVar7;
  }
  uStack_120 = (char)uVar6;
  uStack_11f._0_1_ = (undefined1)(uVar6 >> 8);
  uStack_11f._1_1_ = (char)uVar6;
  uStack_11f._2_1_ = (undefined1)uStack_11f;
  uVar3 = (undefined4)uVar8;
  if (0xfffffffe < uVar8) {
    uVar3 = 0xffffffff;
  }
  uStack_11f._3_1_ = (char)uVar3;
  uStack_11b = (char)((uint)uVar3 >> 8);
  uVar8 = 0xffffffff;
  if (mVar9 < 0xffffffff) {
    uVar8 = mVar9;
  }
  uStack_11a = (char)((uint)uVar3 >> 0x10);
  uStack_119 = (char)((uint)uVar3 >> 0x18);
  uStack_118 = (char)uVar8;
  auStack_117[0] = (char)(uVar8 >> 8);
  auStack_117[1] = (char)(uVar8 >> 0x10);
  auStack_114 = auVar1._20_44_;
  auStack_117[2] = (char)(uVar8 >> 0x18);
  sVar5 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar11,local_128,0x16);
  if (sVar5 == 0x16) {
    if (((FILE *)pmVar2->m_pFile != (FILE *)0x0) &&
       (iVar4 = fflush((FILE *)pmVar2->m_pFile), iVar4 == -1)) {
      pZip->m_last_error = MZ_ZIP_FILE_CLOSE_FAILED;
      return 0;
    }
    pZip->m_archive_size = pZip->m_archive_size + 0x16;
    pZip->m_zip_mode = MZ_ZIP_MODE_WRITING_HAS_BEEN_FINALIZED;
    return 1;
  }
LAB_00114dff:
  pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
  return 0;
}

Assistant:

inline mz_bool mz_zip_writer_finalize_archive(mz_zip_archive* pZip) {

    mz_zip_internal_state* pState;
    mz_uint64 central_dir_ofs, central_dir_size;
    mz_uint8 hdr[256];

    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    if (pState->m_zip64) {
        if ((pZip->m_total_files > MZ_UINT32_MAX) || (pState->m_central_dir.m_size >= MZ_UINT32_MAX))
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else {
        if ((pZip->m_total_files > MZ_UINT16_MAX)
                || ((pZip->m_archive_size + pState->m_central_dir.m_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
                        > MZ_UINT32_MAX))
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }

    central_dir_ofs = 0;
    central_dir_size = 0;
    if (pZip->m_total_files) {
        /* Write central directory */
        central_dir_ofs = pZip->m_archive_size;
        central_dir_size = pState->m_central_dir.m_size;
        pZip->m_central_directory_file_ofs = central_dir_ofs;
        if (pZip->m_pWrite(pZip->m_pIO_opaque,
                           central_dir_ofs,
                           pState->m_central_dir.m_p,
                           (size_t)central_dir_size) != central_dir_size)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        pZip->m_archive_size += central_dir_size;
    }

    if (pState->m_zip64) {
        /* Write zip64 end of central directory header */
        mz_uint64 rel_ofs_to_zip64_ecdr = pZip->m_archive_size;

        MZ_CLEAR_OBJ(hdr);
        MZ_WRITE_LE32(hdr + MZ_ZIP64_ECDH_SIG_OFS, MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIG);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDH_SIZE_OF_RECORD_OFS,
                      MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE - sizeof(mz_uint32) - sizeof(mz_uint64));
        MZ_WRITE_LE16(hdr + MZ_ZIP64_ECDH_VERSION_MADE_BY_OFS, 0x031E); /* TODO: always Unix */
        MZ_WRITE_LE16(hdr + MZ_ZIP64_ECDH_VERSION_NEEDED_OFS, 0x002D);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS, pZip->m_total_files);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDH_CDIR_TOTAL_ENTRIES_OFS, pZip->m_total_files);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDH_CDIR_SIZE_OFS, central_dir_size);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDH_CDIR_OFS_OFS, central_dir_ofs);
        if (pZip->m_pWrite(pZip->m_pIO_opaque,
                           pZip->m_archive_size,
                           hdr,
                           MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE) != MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        pZip->m_archive_size += MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE;

        /* Write zip64 end of central directory locator */
        MZ_CLEAR_OBJ(hdr);
        MZ_WRITE_LE32(hdr + MZ_ZIP64_ECDL_SIG_OFS, MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIG);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDL_REL_OFS_TO_ZIP64_ECDR_OFS, rel_ofs_to_zip64_ecdr);
        MZ_WRITE_LE32(hdr + MZ_ZIP64_ECDL_TOTAL_NUMBER_OF_DISKS_OFS, 1);
        if (pZip->m_pWrite(pZip->m_pIO_opaque,
                           pZip->m_archive_size,
                           hdr,
                           MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE) != MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        pZip->m_archive_size += MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE;
    }

    /* Write end of central directory record */
    MZ_CLEAR_OBJ(hdr);
    MZ_WRITE_LE32(hdr + MZ_ZIP_ECDH_SIG_OFS, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG);
    MZ_WRITE_LE16(hdr + MZ_ZIP_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS, MZ_MIN(MZ_UINT16_MAX, pZip->m_total_files));
    MZ_WRITE_LE16(hdr + MZ_ZIP_ECDH_CDIR_TOTAL_ENTRIES_OFS, MZ_MIN(MZ_UINT16_MAX, pZip->m_total_files));
    MZ_WRITE_LE32(hdr + MZ_ZIP_ECDH_CDIR_SIZE_OFS, MZ_MIN(MZ_UINT32_MAX, central_dir_size));
    MZ_WRITE_LE32(hdr + MZ_ZIP_ECDH_CDIR_OFS_OFS, MZ_MIN(MZ_UINT32_MAX, central_dir_ofs));

    if (pZip->m_pWrite(pZip->m_pIO_opaque,
                       pZip->m_archive_size,
                       hdr,
                       MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) != MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

#ifndef MINIZ_NO_STDIO
    if ((pState->m_pFile) && (MZ_FFLUSH(pState->m_pFile) == EOF))
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_CLOSE_FAILED);
#endif /* #ifndef MINIZ_NO_STDIO */

    pZip->m_archive_size += MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE;

    pZip->m_zip_mode = MZ_ZIP_MODE_WRITING_HAS_BEEN_FINALIZED;
    return MZ_TRUE;
}